

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O2

Point __thiscall MarkerIndex::get_end(MarkerIndex *this,MarkerId id)

{
  const_iterator cVar1;
  MarkerId local_14;
  Point local_10;
  
  local_14 = id;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->end_nodes_by_id)._M_h,&local_14);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    Point::Point(&local_10);
  }
  else {
    local_10 = get_node_position(this,*(Node **)((long)cVar1.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_MarkerIndex::Node_*>,_false>
                                                  ._M_cur + 0x10));
  }
  return local_10;
}

Assistant:

Point MarkerIndex::get_end(MarkerId id) const {
  auto result = end_nodes_by_id.find(id);
  if (result == end_nodes_by_id.end())
    return Point();
  else
    return get_node_position(result->second);
}